

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvsFoodWeb_ASAp_kry.c
# Opt level: O2

int Precond(sunrealtype t,N_Vector c,N_Vector fc,int jok,int *jcurPtr,sunrealtype gamma,
           void *user_data)

{
  long lVar1;
  double dVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  int jy;
  int jx;
  undefined8 uVar7;
  int iVar8;
  sunrealtype *cdata;
  long lVar9;
  ulong uVar10;
  long lVar11;
  sunrealtype *cdotdata;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  long lVar15;
  undefined4 in_register_00000014;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  double dVar20;
  double dVar21;
  ulong in_XMM1_Qb;
  int retval;
  double local_58;
  ulong uStack_50;
  double local_48;
  undefined8 uStack_40;
  
  uVar7 = *(undefined8 *)((long)user_data + 0x9928);
  retval = CVodeGetErrWeights(*(undefined8 *)((long)user_data + 0x9938),uVar7,
                              CONCAT44(in_register_00000014,jok));
  iVar8 = check_retval(&retval,"CVodeGetErrWeights",1);
  if (iVar8 == 0) {
    cdata = (sunrealtype *)N_VGetArrayPointer(c);
    lVar9 = N_VGetArrayPointer(uVar7);
    uVar3 = *(uint *)((long)user_data + 0x48);
    uVar4 = *(uint *)((long)user_data + 0x58);
    uVar10 = (ulong)uVar4;
    lVar11 = (long)(int)uVar3;
    dVar2 = *(double *)((long)user_data + 800);
    uVar5 = *(uint *)((long)user_data + 0x5c);
    uVar6 = *(uint *)((long)user_data + 0x60);
    iVar8 = *(int *)((long)user_data + 100);
    cdotdata = (sunrealtype *)N_VGetArrayPointer(*(undefined8 *)((long)user_data + 0x9930));
    dVar20 = (double)N_VWrmsNorm(fc,uVar7);
    uStack_50 = in_XMM1_Qb & 0x7fffffffffffffff;
    dVar20 = ABS(gamma) * 1000.0 * 2.220446049250313e-16 * 2400.0 * dVar20;
    uVar19 = -(ulong)(dVar20 == 0.0);
    local_58 = (double)(uVar19 & 0x3ff0000000000000 | ~uVar19 & (ulong)dVar20);
    uVar19 = 0;
    uVar13 = 0;
    if (0 < (int)uVar3) {
      uVar13 = (ulong)uVar3;
    }
    uVar14 = 0;
    if (0 < (int)uVar5) {
      uVar14 = (ulong)uVar5;
    }
    uVar18 = (ulong)uVar6;
    if ((int)uVar6 < 1) {
      uVar18 = uVar19;
    }
    for (; uVar19 != uVar18; uVar19 = uVar19 + 1) {
      jy = *(int *)((long)user_data + uVar19 * 4 + 0x128);
      for (uVar16 = 0; uVar16 != uVar14; uVar16 = uVar16 + 1) {
        jx = *(int *)((long)user_data + uVar16 * 4 + 0x120);
        lVar15 = (long)(int)(jx * uVar3 + jy * iVar8);
        for (uVar17 = 0; uVar17 != uVar13; uVar17 = uVar17 + 1) {
          lVar1 = uVar17 + lVar15;
          local_48 = cdata[lVar1];
          dVar20 = ABS(local_48) * dVar2;
          dVar21 = local_58 / *(double *)(lVar9 + lVar1 * 8);
          if (dVar20 <= dVar21) {
            dVar20 = dVar21;
          }
          uStack_40 = 0;
          cdata[lVar1] = local_48 + dVar20;
          fblock(dVar20,cdata,jx,jy,cdotdata,(WebData)user_data);
          for (uVar12 = 0; uVar3 != uVar12; uVar12 = uVar12 + 1) {
            *(double *)
             (*(long *)(*(long *)((long)user_data + uVar16 * 8 + uVar19 * (long)(int)uVar5 * 8) +
                       uVar17 * 8) + uVar12 * 8) =
                 (cdotdata[uVar12] - *(double *)((long)user_data + uVar12 * 8 + lVar15 * 8 + 0x328))
                 * (-gamma / dVar20);
          }
          cdata[lVar1] = local_48;
        }
      }
    }
    uVar19 = 0;
    if ((int)uVar4 < 1) {
      uVar10 = 0;
    }
    do {
      if (uVar10 == uVar19) {
        *jcurPtr = 1;
        return 0;
      }
      SUNDlsMat_denseAddIdentity(*(undefined8 *)((long)user_data + uVar19 * 8),lVar11);
      lVar9 = SUNDlsMat_denseGETRF
                        (*(undefined8 *)((long)user_data + uVar19 * 8),lVar11,lVar11,
                         *(undefined8 *)((long)user_data + uVar19 * 8 + 0x20));
      uVar19 = uVar19 + 1;
    } while (lVar9 == 0);
  }
  return 1;
}

Assistant:

static int Precond(sunrealtype t, N_Vector c, N_Vector fc, sunbooleantype jok,
                   sunbooleantype* jcurPtr, sunrealtype gamma, void* user_data)
{
  sunrealtype*** P;
  sunindextype** pivot;
  int i, if0, if00, ig, igx, igy, j, jj, jx, jy;
  int *jxr, *jyr, ngrp, ngx, ngy, mxmp, mp, retval;
  sunindextype denseretval;
  sunrealtype uround, fac, r, r0, save, srur;
  sunrealtype *f1, *fsave, *cdata, *rewtdata;
  WebData wdata;
  N_Vector rewt;

  wdata  = (WebData)user_data;
  rewt   = wdata->rewt;
  retval = CVodeGetErrWeights(wdata->cvode_mem, rewt);
  if (check_retval(&retval, "CVodeGetErrWeights", 1)) { return (1); }

  cdata    = N_VGetArrayPointer(c);
  rewtdata = N_VGetArrayPointer(rewt);

  uround = SUN_UNIT_ROUNDOFF;

  P     = wdata->P;
  pivot = wdata->pivot;
  jxr   = wdata->jxr;
  jyr   = wdata->jyr;
  mp    = wdata->mp;
  srur  = wdata->srur;
  ngrp  = wdata->ngrp;
  ngx   = wdata->ngx;
  ngy   = wdata->ngy;
  mxmp  = wdata->mxmp;
  fsave = wdata->fsave;

  /* Make mp calls to fblock to approximate each diagonal block of Jacobian.
     Here, fsave contains the base value of the rate vector and
     r0 is a minimum increment factor for the difference quotient. */

  f1 = N_VGetArrayPointer(wdata->vtemp);

  fac = N_VWrmsNorm(fc, rewt);
  r0  = SUN_RCONST(1000.0) * SUNRabs(gamma) * uround * NEQ * fac;
  if (r0 == ZERO) { r0 = ONE; }

  for (igy = 0; igy < ngy; igy++)
  {
    jy   = jyr[igy];
    if00 = jy * mxmp;
    for (igx = 0; igx < ngx; igx++)
    {
      jx  = jxr[igx];
      if0 = if00 + jx * mp;
      ig  = igx + igy * ngx;
      /* Generate ig-th diagonal block */
      for (j = 0; j < mp; j++)
      {
        /* Generate the jth column as a difference quotient */
        jj   = if0 + j;
        save = cdata[jj];
        r    = MAX(srur * SUNRabs(save), r0 / rewtdata[jj]);
        cdata[jj] += r;
        fac = -gamma / r;
        fblock(t, cdata, jx, jy, f1, wdata);
        for (i = 0; i < mp; i++)
        {
          P[ig][j][i] = (f1[i] - fsave[if0 + i]) * fac;
        }
        cdata[jj] = save;
      }
    }
  }

  /* Add identity matrix and do LU decompositions on blocks. */

  for (ig = 0; ig < ngrp; ig++)
  {
    SUNDlsMat_denseAddIdentity(P[ig], mp);
    denseretval = SUNDlsMat_denseGETRF(P[ig], mp, mp, pivot[ig]);
    if (denseretval != 0) { return (1); }
  }

  *jcurPtr = SUNTRUE;
  return (0);
}